

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistent_storage_json_test.cpp
# Opt level: O0

void __thiscall
PersistentStorageJsonTestSuite_ReadNonEmptyDefault_Test::TestBody
          (PersistentStorageJsonTestSuite_ReadNonEmptyDefault_Test *this)

{
  Status SVar1;
  bool bVar2;
  char *pcVar3;
  char *in_R9;
  string local_118;
  AssertHelper local_f8;
  Message local_f0;
  bool local_e1;
  undefined1 local_e0 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_b0;
  Message local_a8;
  bool local_99;
  undefined1 local_98 [8];
  AssertionResult gtest_ar_;
  allocator local_71;
  string local_70;
  undefined1 local_50 [8];
  PersistentStorageJson psj;
  PersistentStorageJsonTestSuite_ReadNonEmptyDefault_Test *this_local;
  
  psj.mStorageLock.mPlatform = (sem_t *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_70,"./tmp/test.tmp",&local_71);
  ot::commissioner::persistent_storage::PersistentStorageJson::PersistentStorageJson
            ((PersistentStorageJson *)local_50,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  SVar1 = ot::commissioner::persistent_storage::PersistentStorageJson::Open
                    ((PersistentStorageJson *)local_50);
  local_99 = SVar1 == kSuccess;
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_98,&local_99,(type *)0x0)
  ;
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_98);
  if (!bVar2) {
    testing::Message::Message(&local_a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_98,
               (AssertionResult *)"psj.Open() == PersistentStorage::Status::kSuccess","false","true"
               ,in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json_test.cpp"
               ,0x50,pcVar3);
    testing::internal::AssertHelper::operator=(&local_b0,&local_a8);
    testing::internal::AssertHelper::~AssertHelper(&local_b0);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_98);
  SVar1 = ot::commissioner::persistent_storage::PersistentStorageJson::Close
                    ((PersistentStorageJson *)local_50);
  local_e1 = SVar1 == kSuccess;
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_e0,&local_e1,(type *)0x0)
  ;
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e0);
  if (!bVar2) {
    testing::Message::Message(&local_f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_118,(internal *)local_e0,
               (AssertionResult *)"psj.Close() == PersistentStorage::Status::kSuccess","false",
               "true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json_test.cpp"
               ,0x51,pcVar3);
    testing::internal::AssertHelper::operator=(&local_f8,&local_f0);
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    std::__cxx11::string::~string((string *)&local_118);
    testing::Message::~Message(&local_f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e0);
  ot::commissioner::persistent_storage::PersistentStorageJson::~PersistentStorageJson
            ((PersistentStorageJson *)local_50);
  return;
}

Assistant:

TEST(PersistentStorageJsonTestSuite, ReadNonEmptyDefault)
{
    PersistentStorageJson psj("./tmp/test.tmp");

    EXPECT_TRUE(psj.Open() == PersistentStorage::Status::kSuccess);
    EXPECT_TRUE(psj.Close() == PersistentStorage::Status::kSuccess);
}